

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Handle_Return<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>::
handle<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,void>
          (Handle_Return<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>> *this,
          pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  element_type *local_18;
  pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *r_local;
  
  local_18 = (element_type *)r;
  r_local = (pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *)this;
  std::
  make_shared<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            ((pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *)&stack0xffffffffffffffd8);
  Boxed_Value::
  Boxed_Value<std::shared_ptr<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,void>
            ((Boxed_Value *)this,
             (shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> *)
             &stack0xffffffffffffffd8,true);
  std::shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>::~shared_ptr
            ((shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> *)
             &stack0xffffffffffffffd8);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }